

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_NtkFindSatAssign_rec(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Pdr_Set_t *pCube,int Heur)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pNode_00;
  uint uVar4;
  Aig_Obj_t *pObj;
  uint uVar5;
  bool bVar6;
  
  while( true ) {
    pObj = pNode;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar3 = (uint)*(ulong *)&pObj->field_0x18;
    bVar6 = true;
    if ((uVar3 & 7) == 1) goto LAB_004e67d5;
    if (pObj->TravId == pAig->nTravIds) break;
    pObj->TravId = pAig->nTravIds;
    *(ulong *)&pObj->field_0x18 =
         *(ulong *)&pObj->field_0x18 & 0xffffffffffffffef | (ulong)((Value & 1U) << 4);
    if ((uVar3 & 7) == 2) {
      iVar2 = Aig_ObjCioId(pObj);
      if (pAig->nTruePis <= iVar2) {
        iVar2 = Aig_ObjCioId(pObj);
        if ((1 < (uint)Value) || (iVar2 = iVar2 - pAig->nTruePis, iVar2 < 0)) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar1 = pCube->nLits;
        pCube->nLits = iVar1 + 1;
        *(int *)(&pCube->field_0x14 + (long)iVar1 * 4) = Value + iVar2 * 2;
        pCube->Sign = pCube->Sign | 1L << ((byte)((&pCube->nLits)[pCube->nLits] % 0x3f) & 0x3f);
      }
      goto LAB_004e67d5;
    }
    if ((uVar3 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                    ,0x2fc,
                    "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)")
      ;
    }
    pNode_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    uVar3 = (uint)pObj->pFanin0 & 1;
    if (Value == 0) {
      iVar2 = pNode_00->TravId;
      iVar1 = pAig->nTravIds;
      if ((iVar2 == iVar1) && ((*(uint *)&pNode_00->field_0x18 >> 4 & 1) == uVar3))
      goto LAB_004e67d5;
      pNode = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      uVar5 = (uint)pObj->pFanin1 & 1;
      if (pNode->TravId == iVar1) {
        uVar4 = *(uint *)&pNode->field_0x18 >> 4 & 1;
        bVar6 = uVar4 == uVar5;
        if ((iVar2 == iVar1) || (pNode = pNode_00, Value = uVar3, uVar4 == uVar5))
        goto LAB_004e67d5;
      }
      else {
        Value = uVar5;
        if ((iVar2 != iVar1) && (pObj->Id % 4 != Heur)) {
          pNode = pNode_00;
          Value = uVar3;
        }
      }
    }
    else {
      iVar2 = Pdr_NtkFindSatAssign_rec(pAig,pNode_00,uVar3 ^ 1,pCube,Heur);
      if (iVar2 == 0) {
        bVar6 = false;
        goto LAB_004e67d5;
      }
      pNode = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      Value = ~(uint)pObj->pFanin1 & 1;
    }
  }
  bVar6 = (uVar3 >> 4 & 1) == Value;
LAB_004e67d5:
  return (int)bVar6;
}

Assistant:

int Pdr_NtkFindSatAssign_rec( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Pdr_Set_t * pCube, int Heur )
{
    int Value0, Value1;
    if ( Aig_ObjIsConst1(pNode) )
        return 1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pNode) )
        return ((int)pNode->fMarkA == Value);
    Aig_ObjSetTravIdCurrent(pAig, pNode);
    pNode->fMarkA = Value;
    if ( Aig_ObjIsCi(pNode) )
    {
        if ( Saig_ObjIsLo(pAig, pNode) )
        {
//            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), !Value );
            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), Value );
            pCube->Sign |= ((word)1 << (pCube->Lits[pCube->nLits-1] % 63));
        }
        return 1;
    }
    assert( Aig_ObjIsNode(pNode) );
    // propagation
    if ( Value ) 
    {
        if ( !Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), !Aig_ObjFaninC0(pNode), pCube, Heur) )
            return 0;
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), !Aig_ObjFaninC1(pNode), pCube, Heur);
    }
    // justification
    Value0 = Pdr_ObjSatValue( pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode) );
    if ( Value0 == PDR_VAL0 )
        return 1;
    Value1 = Pdr_ObjSatValue( pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode) );
    if ( Value1 == PDR_VAL0 )
        return 1;
    if ( Value0 == PDR_VAL1 && Value1 == PDR_VAL1 )
        return 0;
    if ( Value0 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    if ( Value1 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
    assert( Value0 == PDR_VALX && Value1 == PDR_VALX );
    // decision making
//    if ( rand() % 10 == Heur )
    if ( Aig_ObjId(pNode) % 4 == Heur )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    else
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
}